

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::VariableSymbol::serializeTo(VariableSymbol *this,ASTSerializer *serializer)

{
  ushort uVar1;
  string_view sVar2;
  string str;
  
  sVar2 = ast::toString(this->lifetime);
  ASTSerializer::write(serializer,8,"lifetime",sVar2._M_len);
  uVar1 = (this->flags).m_bits;
  if (uVar1 != 0) {
    str._M_dataplus._M_p = (pointer)&str.field_2;
    str._M_string_length = 0;
    str.field_2._M_local_buf[0] = '\0';
    if ((uVar1 & 1) != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&str,"const,");
      uVar1 = (this->flags).m_bits;
    }
    if ((uVar1 & 2) != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&str,"compiler_generated,");
      uVar1 = (this->flags).m_bits;
    }
    if ((uVar1 & 4) != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&str,"imm_cov_option,");
      uVar1 = (this->flags).m_bits;
    }
    if ((uVar1 & 8) != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&str,"formal_cov_sample,");
      uVar1 = (this->flags).m_bits;
    }
    if ((uVar1 & 0x10) != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&str,"checker_free,");
      uVar1 = (this->flags).m_bits;
    }
    if ((uVar1 & 0x20) != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&str,"ref_static,");
    }
    if (str._M_string_length != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                (&str);
      ASTSerializer::write(serializer,5,"flags",(size_t)&str);
    }
    std::__cxx11::string::~string((string *)&str);
  }
  return;
}

Assistant:

void VariableSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("lifetime", toString(lifetime));

    if (flags) {
        std::string str;
        if (flags.has(VariableFlags::Const))
            str += "const,";
        if (flags.has(VariableFlags::CompilerGenerated))
            str += "compiler_generated,";
        if (flags.has(VariableFlags::ImmutableCoverageOption))
            str += "imm_cov_option,";
        if (flags.has(VariableFlags::CoverageSampleFormal))
            str += "formal_cov_sample,";
        if (flags.has(VariableFlags::CheckerFreeVariable))
            str += "checker_free,";
        if (flags.has(VariableFlags::RefStatic))
            str += "ref_static,";
        if (!str.empty()) {
            str.pop_back();
            serializer.write("flags", str);
        }
    }
}